

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::EnumSchema::EnumSchema(EnumSchema *this,string *name)

{
  Node *pNVar1;
  Name NStack_58;
  
  pNVar1 = (Node *)operator_new(0xa8);
  NodeEnum::NodeEnum((NodeEnum *)pNVar1);
  Schema::Schema(&this->super_Schema,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001eb9b0;
  pNVar1 = (this->super_Schema).node_.px;
  Name::Name(&NStack_58,name);
  Node::setName(pNVar1,&NStack_58);
  Name::~Name(&NStack_58);
  return;
}

Assistant:

EnumSchema::EnumSchema(const std::string &name) :
    Schema(new NodeEnum)
{
    node_->setName(name);
}